

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ForeverStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForeverStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          StatementSyntax *args_3)

{
  Token foreverKeyword;
  ForeverStatementSyntax *this_00;
  StatementSyntax *args_local_3;
  Token *args_local_2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local_1;
  NamedLabelSyntax **args_local;
  BumpAllocator *this_local;
  
  this_00 = (ForeverStatementSyntax *)allocate(this,0x60,8);
  foreverKeyword.kind = args_2->kind;
  foreverKeyword._2_1_ = args_2->field_0x2;
  foreverKeyword.numFlags.raw = (args_2->numFlags).raw;
  foreverKeyword.rawLen = args_2->rawLen;
  foreverKeyword.info = args_2->info;
  slang::syntax::ForeverStatementSyntax::ForeverStatementSyntax
            (this_00,*args,args_1,foreverKeyword,args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }